

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O0

string * google::protobuf::StringPrintfVector
                   (string *__return_storage_ptr__,char *format,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *v)

{
  size_type sVar1;
  LogMessage *pLVar2;
  undefined8 uVar3;
  uint local_1a0;
  int local_19c;
  int i_1;
  int i;
  char *cstr [32];
  LogMessage local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v_local;
  char *format_local;
  
  local_48 = v;
  v_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)format;
  format_local = (char *)__return_storage_ptr__;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(v);
  if (0x20 < sVar1) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringprintf.cc"
               ,0x8d);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_80,"CHECK failed: (v.size()) <= (kStringPrintfVectorMaxArgs): ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"StringPrintfVector currently only supports up to ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,0x20);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," arguments. ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"Feel free to add support for more if you need it.");
    internal::LogFinisher::operator=((LogFinisher *)((long)cstr + 0xfb),pLVar2);
    internal::LogMessage::~LogMessage(&local_80);
  }
  for (local_19c = 0;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_48), (ulong)(long)local_19c < sVar1; local_19c = local_19c + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_48,(long)local_19c);
    uVar3 = std::__cxx11::string::c_str();
    *(undefined8 *)(&i_1 + (long)local_19c * 2) = uVar3;
  }
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_48);
  for (local_1a0 = (uint)sVar1; local_1a0 < 0x20; local_1a0 = local_1a0 + 1) {
    *(undefined1 **)(&i_1 + (long)(int)local_1a0 * 2) = string_printf_empty_block;
  }
  StringPrintf_abi_cxx11_
            (__return_storage_ptr__,(char *)v_local,_i_1,cstr[0],cstr[1],cstr[2],cstr[3],cstr[4],
             cstr[5],cstr[6],cstr[7],cstr[8],cstr[9],cstr[10],cstr[0xb],cstr[0xc],cstr[0xd],
             cstr[0xe],cstr[0xf],cstr[0x10],cstr[0x11],cstr[0x12],cstr[0x13],cstr[0x14],cstr[0x15],
             cstr[0x16],cstr[0x17],cstr[0x18],cstr[0x19],cstr[0x1a],cstr[0x1b],cstr[0x1c],cstr[0x1d]
             ,cstr[0x1e]);
  return __return_storage_ptr__;
}

Assistant:

string StringPrintfVector(const char* format, const vector<string>& v) {
  GOOGLE_CHECK_LE(v.size(), kStringPrintfVectorMaxArgs)
      << "StringPrintfVector currently only supports up to "
      << kStringPrintfVectorMaxArgs << " arguments. "
      << "Feel free to add support for more if you need it.";

  // Add filler arguments so that bogus format+args have a harder time
  // crashing the program, corrupting the program (%n),
  // or displaying random chunks of memory to users.

  const char* cstr[kStringPrintfVectorMaxArgs];
  for (int i = 0; i < v.size(); ++i) {
    cstr[i] = v[i].c_str();
  }
  for (int i = v.size(); i < GOOGLE_ARRAYSIZE(cstr); ++i) {
    cstr[i] = &string_printf_empty_block[0];
  }

  // I do not know any way to pass kStringPrintfVectorMaxArgs arguments,
  // or any way to build a va_list by hand, or any API for printf
  // that accepts an array of arguments.  The best I can do is stick
  // this COMPILE_ASSERT right next to the actual statement.

  GOOGLE_COMPILE_ASSERT(kStringPrintfVectorMaxArgs == 32, arg_count_mismatch);
  return StringPrintf(format,
                      cstr[0], cstr[1], cstr[2], cstr[3], cstr[4],
                      cstr[5], cstr[6], cstr[7], cstr[8], cstr[9],
                      cstr[10], cstr[11], cstr[12], cstr[13], cstr[14],
                      cstr[15], cstr[16], cstr[17], cstr[18], cstr[19],
                      cstr[20], cstr[21], cstr[22], cstr[23], cstr[24],
                      cstr[25], cstr[26], cstr[27], cstr[28], cstr[29],
                      cstr[30], cstr[31]);
}